

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# apted_tree_index_impl.h
# Opt level: O0

double __thiscall
ted::APTEDTreeIndex<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexAPTED>::spfL
          (APTEDTreeIndex<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexAPTED>
           *this,TreeIndexAPTED *t1,int t1_current_subtree,TreeIndexAPTED *t2,int t2_current_subtree
          ,bool treesSwapped)

{
  double dVar1;
  int iVar2;
  const_reference pvVar3;
  reference pvVar4;
  double *pdVar5;
  int local_ac;
  undefined1 local_a8 [4];
  int i;
  Matrix<double> forestdist;
  int firstKeyRoot;
  int pathID;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_68;
  allocator<int> local_49;
  undefined1 local_48 [8];
  vector<int,_std::allocator<int>_> keyRoots;
  bool treesSwapped_local;
  int t2_current_subtree_local;
  TreeIndexAPTED *t2_local;
  int t1_current_subtree_local;
  TreeIndexAPTED *t1_local;
  APTEDTreeIndex<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexAPTED> *this_local;
  
  keyRoots.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._3_1_ = treesSwapped;
  keyRoots.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._4_4_ = t2_current_subtree;
  pvVar3 = std::vector<int,_std::allocator<int>_>::operator[]
                     (&(t2->super_PreLToSize).prel_to_size_,(long)t2_current_subtree);
  iVar2 = *pvVar3;
  std::allocator<int>::allocator(&local_49);
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)local_48,(long)iVar2,&local_49);
  std::allocator<int>::~allocator(&local_49);
  local_68._M_current =
       (int *)std::vector<int,_std::allocator<int>_>::begin
                        ((vector<int,_std::allocator<int>_> *)local_48);
  _pathID = std::vector<int,_std::allocator<int>_>::end
                      ((vector<int,_std::allocator<int>_> *)local_48);
  firstKeyRoot = -1;
  std::fill<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,int>
            (local_68,(__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)_pathID,
             &firstKeyRoot);
  pvVar3 = std::vector<int,_std::allocator<int>_>::operator[]
                     (&(t2->super_PreLToLLD).prel_to_lld_,
                      (long)keyRoots.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage._4_4_);
  forestdist.data_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._4_4_ =
       computeKeyRoots(this,t2,keyRoots.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                               super__Vector_impl_data._M_end_of_storage._4_4_,*pvVar3,
                       (vector<int,_std::allocator<int>_> *)local_48,0);
  pvVar3 = std::vector<int,_std::allocator<int>_>::operator[]
                     (&(t1->super_PreLToSize).prel_to_size_,(long)t1_current_subtree);
  iVar2 = *pvVar3;
  pvVar3 = std::vector<int,_std::allocator<int>_>::operator[]
                     (&(t2->super_PreLToSize).prel_to_size_,
                      (long)keyRoots.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage._4_4_);
  data_structures::Matrix<double>::Matrix
            ((Matrix<double> *)local_a8,(long)(iVar2 + 1),(long)(*pvVar3 + 1));
  local_ac = forestdist.data_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage._4_4_;
  while (local_ac = local_ac + -1, -1 < local_ac) {
    pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)local_48,(long)local_ac);
    treeEditDist(this,t1,t2,t1_current_subtree,*pvVar4,(Matrix<double> *)local_a8,
                 (bool)(keyRoots.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage._3_1_ & 1));
  }
  pvVar3 = std::vector<int,_std::allocator<int>_>::operator[]
                     (&(t1->super_PreLToSize).prel_to_size_,(long)t1_current_subtree);
  iVar2 = *pvVar3;
  pvVar3 = std::vector<int,_std::allocator<int>_>::operator[]
                     (&(t2->super_PreLToSize).prel_to_size_,
                      (long)keyRoots.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage._4_4_);
  pdVar5 = data_structures::Matrix<double>::read_at
                     ((Matrix<double> *)local_a8,(long)iVar2,(long)*pvVar3);
  dVar1 = *pdVar5;
  data_structures::Matrix<double>::~Matrix((Matrix<double> *)local_a8);
  std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)local_48);
  return dVar1;
}

Assistant:

double APTEDTreeIndex<CostModel, TreeIndex>::spfL(const TreeIndex& t1,
    int t1_current_subtree, const TreeIndex& t2,
    int t2_current_subtree, bool treesSwapped) {
  // Initialise the array to store the keyroot nodes in the right-hand input
  // subtree.
  std::vector<int> keyRoots(t2.prel_to_size_[t2_current_subtree]);
  // Arrays.fill(keyRoots, -1);
  std::fill(keyRoots.begin(), keyRoots.end(), -1);
  // Get the leftmost leaf node of the right-hand input subtree.
  int pathID = t2.prel_to_lld_[t2_current_subtree];
  // Calculate the keyroot nodes in the right-hand input subtree.
  // firstKeyRoot is the index in keyRoots of the first keyroot node that
  // we have to process. We need this index because keyRoots array is larger
  // than the number of keyroot nodes.
  int firstKeyRoot = computeKeyRoots(t2, t2_current_subtree, pathID, keyRoots, 0);
  // Initialise an array to store intermediate distances for subforest pairs.
  data_structures::Matrix<double> forestdist(t1.prel_to_size_[t1_current_subtree]+1, t2.prel_to_size_[t2_current_subtree]+1);
  // Compute the distances between pairs of keyroot nodes. In the left-hand
  // input subtree only the root is the keyroot. Thus, we compute the distance
  // between the left-hand input subtree and all keyroot nodes in the
  // right-hand input subtree.
  for (int i = firstKeyRoot-1; i >= 0; --i) {
    treeEditDist(t1, t2, t1_current_subtree, keyRoots[i], forestdist, treesSwapped);
  }
  // Return the distance between the input subtrees.
  // std::cout << "spfL = " << forestdist.read_at(ni_1.preL_to_size_[ni_1.get_current_node()], ni_2.preL_to_size_[ni_2.get_current_node()]) << std::endl;
  return forestdist.read_at(t1.prel_to_size_[t1_current_subtree], t2.prel_to_size_[t2_current_subtree]);
}